

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O1

void __thiscall hwnet::Poller::Enable(Poller *this,Ptr *channel,int flag)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  iVar3 = (*((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Channel[1])();
  uVar1 = (this->channels)._M_h._M_bucket_count;
  uVar4 = (ulong)(long)iVar3 % uVar1;
  p_Var5 = (this->channels)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, iVar3 != *(int *)&p_Var5->_M_nxt[1]._M_nxt)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, iVar3 == *(int *)&p_Var2[1]._M_nxt)) goto LAB_0011b22d;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0011b22d:
  if ((p_Var6 != (__node_base_ptr)0x0) && (p_Var6->_M_nxt != (_Hash_node_base *)0x0)) {
    Epoll::Enable(&this->poller_,channel,flag);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void Poller::Enable(const Channel::Ptr &channel,int flag) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->channels.find(channel->Fd()) == this->channels.end()) {
		return;
	} else {
		poller_.Enable(channel,flag);
	}
}